

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  undefined8 *puVar6;
  bool bVar7;
  uint uVar8;
  Limit limit;
  string *psVar9;
  FileDescriptorProto *this_00;
  uint8 *puVar10;
  uint32 tag;
  uint32 local_44;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->file_to_generate_).super_RepeatedPtrFieldBase;
  local_40 = &(this->proto_file_).super_RepeatedPtrFieldBase;
LAB_0018956e:
  while( true ) {
    puVar10 = input->buffer_;
    if ((puVar10 < input->buffer_end_) && (tag = (uint32)(char)*puVar10, -1 < (char)*puVar10)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar10 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar8 = tag >> 3;
    if (uVar8 != 0xf) break;
    if ((tag & 7) != 2) goto LAB_001896f9;
    while( true ) {
      iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (FileDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve(local_40,iVar3 + 1);
        }
        piVar1 = &(this->proto_file_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
        (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = this_00;
      }
      puVar10 = input->buffer_;
      if ((puVar10 < input->buffer_end_) && (uVar2 = *puVar10, -1 < (char)uVar2)) {
        input->buffer_ = puVar10 + 1;
        local_44 = (int)(char)uVar2;
      }
      else {
        bVar7 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar7) {
          return false;
        }
      }
      iVar3 = input->recursion_depth_;
      input->recursion_depth_ = iVar3 + 1;
      if (input->recursion_limit_ <= iVar3) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_44);
      bVar7 = FileDescriptorProto::MergePartialFromCodedStream(this_00,input);
      if (!bVar7) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar10 = input->buffer_;
      if ((input->buffer_end_ <= puVar10) || (*puVar10 != 'z')) break;
LAB_00189823:
      input->buffer_ = puVar10 + 1;
    }
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  }
  if (uVar8 == 2) {
    if ((tag & 7) == 2) goto LAB_0018967b;
  }
  else if ((uVar8 == 1) && ((tag & 7) == 2)) {
    while( true ) {
      iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
        (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        psVar9 = (string *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve(local_38,iVar3 + 1);
        }
        piVar1 = &(this->file_to_generate_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        psVar9 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = psVar9;
      }
      bVar7 = internal::WireFormatLite::ReadString(input,psVar9);
      if (!bVar7) {
        return false;
      }
      puVar6 = (undefined8 *)
               (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_
               [(long)(this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ + -1];
      internal::WireFormat::VerifyUTF8StringFallback((char *)*puVar6,*(int *)(puVar6 + 1),PARSE);
      puVar10 = input->buffer_;
      if ((input->buffer_end_ <= puVar10) || (*puVar10 != '\n')) break;
      input->buffer_ = puVar10 + 1;
    }
    puVar10 = input->buffer_;
    if ((puVar10 < input->buffer_end_) && (*puVar10 == '\x12')) {
      input->buffer_ = puVar10 + 1;
LAB_0018967b:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      if (this->parameter_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar9 = (string *)operator_new(0x20);
        (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
        psVar9->_M_string_length = 0;
        (psVar9->field_2)._M_local_buf[0] = '\0';
        this->parameter_ = psVar9;
      }
      bVar7 = internal::WireFormatLite::ReadString(input,this->parameter_);
      if (!bVar7) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,PARSE)
      ;
      puVar10 = input->buffer_;
      if ((puVar10 < input->buffer_end_) && (*puVar10 == 'z')) goto LAB_00189823;
    }
    goto LAB_0018956e;
  }
LAB_001896f9:
  if ((tag & 7) == 4) {
    return true;
  }
  bVar7 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
  if (!bVar7) {
    return false;
  }
  goto LAB_0018956e;
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file_to_generate:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file_to_generate;
        if (input->ExpectTag(18)) goto parse_parameter;
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_parameter:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_proto_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}